

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlElementPtr xmlGetDtdElementDesc2(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name)

{
  xmlChar *key2;
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlChar *key;
  xmlElementPtr elem;
  xmlChar *pxVar3;
  _xmlDict *dict;
  xmlChar *prefix;
  xmlChar *local_30;
  
  local_30 = (xmlChar *)0x0;
  if (dtd->elements == (void *)0x0) {
    if (dtd->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = dtd->doc->dict;
    }
    elem = (xmlElementPtr)0x0;
    pxVar2 = xmlHashCreateDict(0,dict);
    dtd->elements = pxVar2;
    if (pxVar2 == (xmlHashTablePtr)0x0) goto LAB_00155f28;
  }
  pxVar2 = (xmlHashTablePtr)dtd->elements;
  key = xmlSplitQName4(name,&local_30);
  if (key != (xmlChar *)0x0) {
    elem = (xmlElementPtr)xmlHashLookup2(pxVar2,key,local_30);
    if (elem != (xmlElementPtr)0x0) {
LAB_00155e83:
      if (local_30 == (xmlChar *)0x0) {
        return elem;
      }
      (*xmlFree)(local_30);
      return elem;
    }
    elem = (xmlElementPtr)(*xmlMalloc)(0x70);
    if (elem != (xmlElementPtr)0x0) {
      elem->_private = (void *)0x0;
      *(undefined8 *)&elem->type = 0;
      elem->prefix = (xmlChar *)0x0;
      elem->contModel = (xmlRegexpPtr)0x0;
      elem->content = (xmlElementContentPtr)0x0;
      elem->attributes = (xmlAttributePtr)0x0;
      elem->doc = (_xmlDoc *)0x0;
      *(undefined8 *)&elem->etype = 0;
      elem->next = (_xmlNode *)0x0;
      elem->prev = (_xmlNode *)0x0;
      elem->last = (_xmlNode *)0x0;
      elem->parent = (_xmlDtd *)0x0;
      elem->name = (xmlChar *)0x0;
      elem->children = (_xmlNode *)0x0;
      elem->type = XML_ELEMENT_DECL;
      elem->doc = dtd->doc;
      pxVar3 = xmlStrdup(key);
      key2 = local_30;
      elem->name = pxVar3;
      if (pxVar3 != (xmlChar *)0x0) {
        elem->prefix = local_30;
        local_30 = (xmlChar *)0x0;
        elem->etype = XML_ELEMENT_TYPE_UNDEFINED;
        iVar1 = xmlHashAdd2(pxVar2,key,key2,elem);
        if (0 < iVar1) goto LAB_00155e83;
      }
      goto LAB_00155f28;
    }
  }
  elem = (xmlElementPtr)0x0;
LAB_00155f28:
  xmlVErrMemory(ctxt);
  (*xmlFree)(local_30);
  xmlFreeElement(elem);
  return (xmlElementPtr)0x0;
}

Assistant:

static xmlElementPtr
xmlGetDtdElementDesc2(xmlValidCtxtPtr ctxt, xmlDtdPtr dtd, const xmlChar *name) {
    xmlElementTablePtr table;
    xmlElementPtr cur = NULL;
    const xmlChar *localName;
    xmlChar *prefix = NULL;

    if (dtd == NULL) return(NULL);

    /*
     * Create the Element table if needed.
     */
    if (dtd->elements == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;

	dtd->elements = xmlHashCreateDict(0, dict);
	if (dtd->elements == NULL)
            goto mem_error;
    }
    table = (xmlElementTablePtr) dtd->elements;

    localName = xmlSplitQName4(name, &prefix);
    if (localName == NULL)
        goto mem_error;
    cur = xmlHashLookup2(table, localName, prefix);
    if (cur == NULL) {
	cur = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (cur == NULL)
            goto mem_error;
	memset(cur, 0, sizeof(xmlElement));
	cur->type = XML_ELEMENT_DECL;
        cur->doc = dtd->doc;

	/*
	 * fill the structure.
	 */
	cur->name = xmlStrdup(localName);
        if (cur->name == NULL)
            goto mem_error;
	cur->prefix = prefix;
        prefix = NULL;
	cur->etype = XML_ELEMENT_TYPE_UNDEFINED;

	if (xmlHashAdd2(table, localName, cur->prefix, cur) <= 0)
            goto mem_error;
    }

    if (prefix != NULL)
        xmlFree(prefix);
    return(cur);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFree(prefix);
    xmlFreeElement(cur);
    return(NULL);
}